

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tag_alias_registry.hpp
# Opt level: O0

TagAliasRegistry * Catch::TagAliasRegistry::get(void)

{
  int iVar1;
  
  if (get()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&get()::instance);
    if (iVar1 != 0) {
      TagAliasRegistry(&get::instance);
      __cxa_atexit(~TagAliasRegistry,&get::instance,&__dso_handle);
      __cxa_guard_release(&get()::instance);
    }
  }
  return &get::instance;
}

Assistant:

TagAliasRegistry& TagAliasRegistry::get() {
        static TagAliasRegistry instance;
        return instance;

    }